

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>
                *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  SchemaAttDef *pSVar2;
  RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *__n;
  void *__buf;
  XMLSize_t t;
  int key2;
  void *key1;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> e;
  int local_6c;
  void *local_68;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> local_60;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    XSerializeEngine::writeSize(serEng,objToStore->fHashModulus);
    t = 0;
    RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::
    RefHash2KeysTableOfEnumerator(&local_60,objToStore,false,objToStore->fMemoryManager);
    while ((local_60.fCurElem != (RefHash2KeysTableBucketElem<xercesc_4_0::SchemaAttDef> *)0x0 ||
           (local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
      RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::
      nextElement(&local_60);
      t = t + 1;
    }
    __n = local_60.fToEnum;
    XSerializeEngine::writeSize(serEng,t);
    RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::Reset
              (&local_60);
    while ((local_60.fCurElem != (RefHash2KeysTableBucketElem<xercesc_4_0::SchemaAttDef> *)0x0 ||
           (__n = local_60.fToEnum, local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
      RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::
      nextElementKey(&local_60,&local_68,&local_6c);
      pSVar2 = RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::get
                         (objToStore,local_68,local_6c);
      XSerializeEngine::write(serEng,(int)pSVar2,__buf,(size_t)__n);
    }
    RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::
    ~RefHash2KeysTableOfEnumerator(&local_60);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHash2KeysTableOf<SchemaAttDef>* const objToStore
                                    , XSerializeEngine&                        serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        XMLSize_t itemNumber = 0;

        RefHash2KeysTableOfEnumerator<SchemaAttDef> e(objToStore, false, objToStore->getMemoryManager());

        while (e.hasMoreElements())
        {
            e.nextElement();
            itemNumber++;
        }

        serEng.writeSize (itemNumber);
        e.Reset();

#ifdef XERCES_DEBUG_SORT_GRAMMAR
        //to sort the key
        SORT_KEYSET_TWOKEYS(serEng.getMemoryManager())

        //to store the data
        for (XMLSize_t i=0; i < itemNumber; i++)
        {
            GET_NEXT_KEYSET()

            SchemaAttDef* data = objToStore->get(strKey, intKey1);
            serEng<<data;

        }
#else

        while (e.hasMoreElements())
        {
            void*       key1;
            int        key2;
            e.nextElementKey(key1, key2);

            SchemaAttDef* data = objToStore->get(key1, key2);
            serEng<<data;

        }
#endif
    }

}